

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSLoader.cpp
# Opt level: O3

void __thiscall Assimp::Discreet3DSImporter::ParseCameraChunk(Discreet3DSImporter *this)

{
  StreamReader<false,_false> *this_00;
  aiCamera *paVar1;
  uint uVar2;
  undefined8 in_RAX;
  float fVar3;
  Chunk chunk;
  undefined8 uStack_28;
  
  if (5 < (uint)(*(int *)&this->stream->limit - *(int *)&this->stream->current)) {
    uStack_28 = in_RAX;
    do {
      ReadChunk(this,(Chunk *)((long)&uStack_28 + 2));
      if (uStack_28._4_4_ + -6 < 1) {
        uVar2 = (int)this->stream->limit - (int)this->stream->current;
      }
      else {
        this_00 = this->stream;
        uVar2 = StreamReader<false,_false>::SetReadLimit
                          (this_00,uStack_28._4_4_ + -6 +
                                   (*(int *)&this_00->current - *(int *)&this_00->buffer));
        if (uStack_28._2_2_ == 0x4720) {
          paVar1 = (this->mScene->mCameras).
                   super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>._M_impl.
                   super__Vector_impl_data._M_finish[-1];
          fVar3 = StreamReader<false,_false>::Get<float>(this->stream);
          paVar1->mClipPlaneNear = fVar3;
          fVar3 = StreamReader<false,_false>::Get<float>(this->stream);
          paVar1->mClipPlaneFar = fVar3;
        }
        this->stream->current = this->stream->limit;
        StreamReader<false,_false>::SetReadLimit(this->stream,uVar2);
        uVar2 = (int)this->stream->limit - (int)this->stream->current;
        if (uVar2 == 0) {
          return;
        }
      }
    } while (5 < uVar2);
  }
  return;
}

Assistant:

void Discreet3DSImporter::ParseCameraChunk()
{
    ASSIMP_3DS_BEGIN_CHUNK();
    aiCamera* camera = mScene->mCameras.back();

    // get chunk type
    switch (chunk.Flag)
    {
        // near and far clip plane
    case Discreet3DS::CHUNK_CAM_RANGES:
        camera->mClipPlaneNear = stream->GetF4();
        camera->mClipPlaneFar  = stream->GetF4();
        break;
    }

    ASSIMP_3DS_END_CHUNK();
}